

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation.cpp
# Opt level: O1

void __thiscall
pstore::repo::definition::definition
          (definition *this,digest d,extent<pstore::repo::fragment> x,
          typed_address<pstore::indirect_string> n,linkage l,visibility v)

{
  byte bVar1;
  byte *pbVar2;
  long lVar3;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  byte local_c [12];
  
  *(address *)&(this->digest).v_ = x.addr.a_.a_.a_;
  *(uint64_t *)((long)&(this->digest).v_ + 8) = x.size;
  (this->fext).addr.a_.a_ = (value_type)n.a_.a_;
  (this->fext).size = CONCAT71(in_register_00000081,l);
  (this->name).a_.a_ = CONCAT71(in_register_00000089,v);
  this->field_3 = (anon_union_1_3_530f19d7_for_definition_3)0x0;
  this->padding1 = '\0';
  this->padding2 = 0;
  this->padding3 = 0;
  pbVar2 = local_c + 3;
  local_c[3] = 0;
  local_c[4] = 1;
  local_c[5] = 2;
  local_c[6] = 3;
  local_c[7] = 4;
  local_c[8] = 5;
  local_c[9] = 6;
  local_c[10] = 7;
  local_c[0xb] = 8;
  lVar3 = 1;
  do {
    if (*pbVar2 < local_c[lVar3 + 3]) {
      pbVar2 = local_c + lVar3 + 3;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 9);
  bVar1 = *pbVar2 >> 1 | *pbVar2;
  bVar1 = bVar1 >> 2 | bVar1;
  if ((byte)(bVar1 >> 4 | bVar1) != 0xf) {
    assert_failed("pstore::round_to_power_of_2 ( static_cast<typename std::underlying_type<Enum>::type> (std::max (init)) + 1U) == Bitfield::max () + 1U"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/mcrepo/compilation.cpp"
                  ,0x33);
  }
  pbVar2 = local_c;
  local_c[0] = 0;
  local_c[1] = 1;
  local_c[2] = 2;
  lVar3 = 1;
  do {
    if (*pbVar2 < local_c[lVar3]) {
      pbVar2 = local_c + lVar3;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  bVar1 = *pbVar2 >> 1 | *pbVar2;
  bVar1 = bVar1 >> 2 | bVar1;
  if ((byte)(bVar1 >> 4 | bVar1) == 3) {
    (this->field_3).bf = (d.v_._8_1_ & 3) << 4 | (byte)d.v_ & 0xf;
    return;
  }
  assert_failed("pstore::round_to_power_of_2 ( static_cast<typename std::underlying_type<Enum>::type> (std::max (init)) + 1U) == Bitfield::max () + 1U"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/mcrepo/compilation.cpp"
                ,0x33);
}

Assistant:

definition::definition (pstore::index::digest const d, pstore::extent<fragment> const x,
                        pstore::typed_address<pstore::indirect_string> const n,
                        enum linkage const l, enum visibility const v) noexcept
        : digest{d}
        , fext{x}
        , name{n} {

    PSTORE_STATIC_ASSERT (std::is_standard_layout<definition>::value);
    PSTORE_STATIC_ASSERT (alignof (definition) == 16);
    PSTORE_STATIC_ASSERT (sizeof (definition) == 48);
    PSTORE_STATIC_ASSERT (offsetof (definition, digest) == 0);
    PSTORE_STATIC_ASSERT (offsetof (definition, fext) == 16);
    PSTORE_STATIC_ASSERT (offsetof (definition, name) == 32);
    PSTORE_STATIC_ASSERT (offsetof (definition, bf) == 40);
    PSTORE_STATIC_ASSERT (offsetof (definition, padding1) == 41);
    PSTORE_STATIC_ASSERT (offsetof (definition, padding2) == 42);
    PSTORE_STATIC_ASSERT (offsetof (definition, padding3) == 44);

#define X(a) repo::linkage::a,
    assert_enum_field_width<enum linkage, decltype (linkage_)> ({PSTORE_REPO_LINKAGES});
#undef X
#define X(a) repo::visibility::a,
    assert_enum_field_width<enum visibility, decltype (visibility_)> ({PSTORE_REPO_VISIBILITIES});
#undef X
    linkage_ = static_cast<std::underlying_type<enum linkage>::type> (l);
    visibility_ = static_cast<std::underlying_type<enum visibility>::type> (v);
}